

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprs.cpp
# Opt level: O3

CTcPrsNode * __thiscall CTcEmbedBuilderSgl::add_segment(CTcEmbedBuilderSgl *this,CTcPrsNode *cur)

{
  _func_int *len;
  _func_int *p_Var1;
  CTcPrsNode *pCVar2;
  _func_int **pp_Var3;
  
  len = (_func_int *)(G_tok->curtok_).text_len_;
  if (len != (_func_int *)0x0) {
    p_Var1 = (_func_int *)(G_tok->curtok_).text_;
    CTcGenTarg::note_str(G_cg,(size_t)len);
    pCVar2 = (CTcPrsNode *)CTcPrsMem::alloc(G_prsmem,0x18);
    pp_Var3 = (_func_int **)CTcPrsMem::alloc(G_prsmem,0x30);
    *(undefined4 *)(pp_Var3 + 1) = 4;
    pp_Var3[2] = p_Var1;
    pp_Var3[3] = len;
    *(undefined1 *)(pp_Var3 + 5) = 0;
    *pp_Var3 = (_func_int *)&PTR_gen_code_00314838;
    pCVar2[1].super_CTcPrsNodeBase._vptr_CTcPrsNodeBase = (_func_int **)cur;
    pCVar2[2].super_CTcPrsNodeBase._vptr_CTcPrsNodeBase = pp_Var3;
    (pCVar2->super_CTcPrsNodeBase)._vptr_CTcPrsNodeBase = (_func_int **)&PTR_gen_code_003163f0;
    cur = pCVar2;
  }
  return cur;
}

Assistant:

virtual CTcPrsNode *add_segment(CTcPrsNode *cur)
    {        
        /* 
         *   Add the next string segment.  We can omit it if it's zero
         *   length, as this will add nothing to the result.  
         */
        if (G_tok->getcur()->get_text_len() != 0)
        {
            CTcConstVal cval;
            cval.set_sstr(G_tok->getcur());
            cur = new CTPNAdd(cur, new CTPNConst(&cval));
        }
        
        /* return the new combined node */
        return cur;
    }